

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5,ArrayPtr<const_char> *params_6,String *params_7,
          ArrayPtr<const_char> *params_8,ArrayPtr<const_char> *params_9,
          ArrayPtr<const_char> *params_10,String *params_11,ArrayPtr<const_char> *params_12,
          CappedArray<char,_14UL> *params_13,ArrayPtr<const_char> *params_14)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  long lVar5;
  size_t sVar6;
  char *pos;
  size_t result_2;
  size_t local_e8;
  char *local_e0;
  size_t sStack_d8;
  size_t local_d0;
  size_t sStack_c8;
  size_t local_c0;
  size_t sStack_b8;
  size_t local_b0;
  size_t local_a8;
  size_t sStack_a0;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  char *pcStack_80;
  undefined8 local_78;
  String local_70;
  StringTree *local_58;
  StringTree *local_50;
  ArrayPtr<const_char> *local_48;
  ArrayPtr<const_char> *local_40;
  ArrayPtr<const_char> *local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_e8 = this->size_;
  local_e0 = (params->text).content.ptr;
  sStack_d8 = params_1->size_;
  local_d0 = params_2->size_;
  sStack_c8 = params_3->size_;
  local_c0 = params_4->size_;
  sStack_b8 = params_5->size_;
  sVar6 = 0;
  local_b0 = params_6->size_ - 1;
  if (params_6->size_ == 0) {
    local_b0 = sVar6;
  }
  local_a8 = (params_7->content).size_;
  sStack_a0 = params_8->size_;
  local_98 = params_9->size_;
  local_90 = params_10->size_ - 1;
  if (params_10->size_ == 0) {
    local_90 = sVar6;
  }
  local_88 = (params_11->content).size_;
  pcStack_80 = params_12->ptr;
  local_78 = *(undefined8 *)params_13->content;
  lVar5 = 0;
  do {
    sVar6 = sVar6 + *(long *)((long)&local_e8 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x78);
  __return_storage_ptr__->size_ = sVar6;
  sVar6 = 0;
  local_e8 = 0;
  local_b0 = 0;
  local_90 = 0;
  lVar5 = 0;
  do {
    sVar6 = sVar6 + *(long *)((long)&local_e8 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x78);
  local_58 = this;
  local_50 = params;
  local_48 = params_1;
  local_40 = params_3;
  local_38 = params_2;
  heapString(&local_70,sVar6);
  (__return_storage_ptr__->text).content.ptr = local_70.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_70.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_70.content.disposer;
  local_e8 = 1;
  local_e0 = (char *)0x0;
  sStack_d8 = 0;
  local_d0 = 0;
  sStack_c8 = 0;
  local_c0 = 0;
  sStack_b8 = 0;
  local_b0 = 1;
  local_a8 = 0;
  sStack_a0 = 0;
  sVar6 = 0;
  local_98 = 0;
  local_90 = 1;
  local_88 = 0;
  pcStack_80 = (char *)0x0;
  local_78 = 0;
  lVar5 = 0;
  do {
    sVar6 = sVar6 + *(long *)((long)&local_e8 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x78);
  pBVar4 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,sVar6,sVar6,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::construct,
                      ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_70.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_70.content.ptr = (char *)pBVar4;
  local_70.content.size_ = sVar6;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar4;
  (__return_storage_ptr__->branches).size_ = sVar6;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,local_58,(ArrayPtr<const_char> *)local_50,local_48,
             local_38,local_40,params_4,params_5,(String *)params_6,(ArrayPtr<const_char> *)params_7
             ,params_8,params_9,(String *)params_10,(ArrayPtr<const_char> *)params_11,
             (CappedArray<char,_14UL> *)params_12,(ArrayPtr<const_char> *)params_13);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}